

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

dgEdge * __thiscall
dgPolyhedra::TriangulateFace
          (dgPolyhedra *this,dgEdge *face,HaF64 *pool,HaI32 stride,
          dgDownHeap<dgEdge_*,_double> *heap,dgBigVector *faceNormalOut)

{
  dgEdge *pdVar1;
  dgEdge *pdVar2;
  int iVar3;
  dgEdge *pdVar4;
  dgEdge *pdVar5;
  dgEdge *pdVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  dgEdge *local_70;
  dgBigVector local_50;
  
  iVar3 = 0x3fff;
  pdVar4 = face;
  do {
    bVar7 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar7) {
      __assert_fail("perimeterCount < hacd::HaI32 (sizeof (perimeter) / sizeof (perimeter[0]))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                    ,0xbe6,
                    "dgEdge *dgPolyhedra::TriangulateFace(dgEdge *, const hacd::HaF64 *const, hacd::HaI32, dgDownHeap<dgEdge *, hacd::HaF64> &, dgBigVector *const)"
                   );
    }
    pdVar4 = pdVar4->m_next;
  } while (pdVar4 != face);
  if (iVar3 != 0) {
    FaceNormal(&local_50,(dgPolyhedra *)face,face,pool,stride * 8);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_50.super_dgTemplateVector<double>.m_x;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_50.super_dgTemplateVector<double>.m_y *
                   local_50.super_dgTemplateVector<double>.m_y;
    auVar8 = vfmadd231sd_fma(auVar8,auVar10,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_50.super_dgTemplateVector<double>.m_z;
    auVar8 = vfmadd231sd_fma(auVar8,auVar11,auVar11);
    dVar9 = auVar8._0_8_;
    if (9.999999960041972e-13 <= dVar9) {
      if (dVar9 < 0.0) {
        local_70 = (dgEdge *)local_50.super_dgTemplateVector<double>.m_y;
        dVar9 = sqrt(dVar9);
      }
      else {
        auVar8 = vsqrtsd_avx(auVar8,auVar8);
        dVar9 = auVar8._0_8_;
      }
      dVar9 = 1.0 / dVar9;
      local_50.super_dgTemplateVector<double>.m_x =
           local_50.super_dgTemplateVector<double>.m_x * dVar9;
      local_50.super_dgTemplateVector<double>.m_y =
           local_50.super_dgTemplateVector<double>.m_y * dVar9;
      local_50.super_dgTemplateVector<double>.m_z =
           local_50.super_dgTemplateVector<double>.m_z * dVar9;
      if ((((0x7fefffffffffffff < (long)ABS(local_50.super_dgTemplateVector<double>.m_x)) ||
           (0x7fefffffffffffff < (long)ABS(local_50.super_dgTemplateVector<double>.m_y))) ||
          (0x7fefffffffffffff < (long)ABS(local_50.super_dgTemplateVector<double>.m_z))) ||
         (0x7fefffffffffffff < (ulong)ABS(local_50.super_dgTemplateVector<double>.m_w))) {
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
      }
      if (faceNormalOut != (dgBigVector *)0x0) {
        (faceNormalOut->super_dgTemplateVector<double>).m_x =
             local_50.super_dgTemplateVector<double>.m_x;
        (faceNormalOut->super_dgTemplateVector<double>).m_y =
             local_50.super_dgTemplateVector<double>.m_y;
        (faceNormalOut->super_dgTemplateVector<double>).m_z =
             local_50.super_dgTemplateVector<double>.m_z;
        (faceNormalOut->super_dgTemplateVector<double>).m_w =
             local_50.super_dgTemplateVector<double>.m_w;
      }
      do {
        if (face->m_next->m_next->m_next == face) {
          return (dgEdge *)0x0;
        }
        pdVar4 = FindEarTip(this,face,pool,stride,heap,&local_50);
        if (pdVar4 == (dgEdge *)0x0) {
          bVar7 = false;
          pdVar1 = face;
        }
        else {
          if ((face == pdVar4) || (face == pdVar4->m_prev)) {
            face = pdVar4->m_prev->m_prev;
          }
          pdVar5 = AddHalfEdge(this,pdVar4->m_next->m_incidentVertex,
                               pdVar4->m_prev->m_incidentVertex);
          if (pdVar5 == (dgEdge *)0x0) {
            bVar7 = false;
            pdVar1 = face;
          }
          else {
            pdVar6 = AddHalfEdge(this,pdVar4->m_prev->m_incidentVertex,
                                 pdVar4->m_next->m_incidentVertex);
            bVar7 = pdVar6 != (dgEdge *)0x0;
            pdVar1 = face;
            if (bVar7) {
              pdVar5->m_mark = pdVar4->m_mark;
              pdVar1 = pdVar4->m_next;
              pdVar5->m_userData = pdVar1->m_userData;
              pdVar5->m_incidentFace = pdVar4->m_incidentFace;
              pdVar6->m_mark = pdVar4->m_mark;
              pdVar2 = pdVar4->m_prev;
              pdVar6->m_userData = pdVar2->m_userData;
              pdVar6->m_incidentFace = pdVar4->m_incidentFace;
              pdVar5->m_twin = pdVar6;
              pdVar6->m_twin = pdVar5;
              pdVar6->m_prev = pdVar2->m_prev;
              pdVar6->m_next = pdVar1;
              pdVar4->m_prev->m_prev->m_next = pdVar6;
              pdVar4->m_next->m_prev = pdVar6;
              pdVar5->m_next = pdVar4->m_prev;
              pdVar5->m_prev = pdVar4;
              pdVar4->m_prev->m_prev = pdVar5;
              pdVar4->m_next = pdVar5;
              (heap->super_dgHeapBase<dgEdge_*,_double>).m_curCount = 0;
              bVar7 = true;
              pdVar1 = local_70;
            }
          }
        }
        local_70 = pdVar1;
      } while (bVar7);
    }
    else {
      local_70 = face;
      if (faceNormalOut != (dgBigVector *)0x0) {
        (faceNormalOut->super_dgTemplateVector<double>).m_x = 0.0;
        (faceNormalOut->super_dgTemplateVector<double>).m_y = 0.0;
        (faceNormalOut->super_dgTemplateVector<double>).m_z = 0.0;
        (faceNormalOut->super_dgTemplateVector<double>).m_w = 0.0;
      }
    }
    return local_70;
  }
  __assert_fail("(perimeterCount + 1) < hacd::HaI32 (sizeof (perimeter) / sizeof (perimeter[0]))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                ,0xbea,
                "dgEdge *dgPolyhedra::TriangulateFace(dgEdge *, const hacd::HaF64 *const, hacd::HaI32, dgDownHeap<dgEdge *, hacd::HaF64> &, dgBigVector *const)"
               );
}

Assistant:

dgEdge* dgPolyhedra::TriangulateFace (dgEdge* face, const hacd::HaF64* const pool, hacd::HaI32 stride, dgDownHeap<dgEdge*, hacd::HaF64>& heap, dgBigVector* const faceNormalOut)
{
	dgEdge* perimeter [1024 * 16]; 
	dgEdge* ptr = face;
	hacd::HaI32 perimeterCount = 0;
	do {
		perimeter[perimeterCount] = ptr;
		perimeterCount ++;
		HACD_ASSERT (perimeterCount < hacd::HaI32 (sizeof (perimeter) / sizeof (perimeter[0])));
		ptr = ptr->m_next;
	} while (ptr != face);
	perimeter[perimeterCount] = face;
	HACD_ASSERT ((perimeterCount + 1) < hacd::HaI32 (sizeof (perimeter) / sizeof (perimeter[0])));

	dgBigVector normal (FaceNormal (face, pool, hacd::HaI32 (stride * sizeof (hacd::HaF64))));

	hacd::HaF64 dot = normal % normal;
	if (dot < hacd::HaF64 (1.0e-12f)) {
		if (faceNormalOut) {
			*faceNormalOut = dgBigVector (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f)); 
		}
		return face;
	}
	normal = normal.Scale (hacd::HaF64 (1.0f) / sqrt (dot));
	if (faceNormalOut) {
		*faceNormalOut = normal;
	}


	while (face->m_next->m_next->m_next != face) {
		dgEdge* const ear = FindEarTip (face, pool, stride, heap, normal); 
		if (!ear) {
			return face;
		}
		if ((face == ear)	|| (face == ear->m_prev)) {
			face = ear->m_prev->m_prev;
		}
		dgEdge* const edge = AddHalfEdge (ear->m_next->m_incidentVertex, ear->m_prev->m_incidentVertex);
		if (!edge) {
			return face;
		}
		dgEdge* const twin = AddHalfEdge (ear->m_prev->m_incidentVertex, ear->m_next->m_incidentVertex);
		if (!twin) {
			return face;
		}
		HACD_ASSERT (twin);


		edge->m_mark = ear->m_mark;
		edge->m_userData = ear->m_next->m_userData;
		edge->m_incidentFace = ear->m_incidentFace;

		twin->m_mark = ear->m_mark;
		twin->m_userData = ear->m_prev->m_userData;
		twin->m_incidentFace = ear->m_incidentFace;

		edge->m_twin = twin;
		twin->m_twin = edge;

		twin->m_prev = ear->m_prev->m_prev;
		twin->m_next = ear->m_next;
		ear->m_prev->m_prev->m_next = twin;
		ear->m_next->m_prev = twin;

		edge->m_next = ear->m_prev;
		edge->m_prev = ear;
		ear->m_prev->m_prev = edge;
		ear->m_next = edge;

		heap.Flush ();
	}
	return NULL;
}